

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysp_node_action ** lysp_node_actions_p(lysp_node *node)

{
  ushort uVar1;
  lysp_node **pplVar2;
  
  if (node != (lysp_node *)0x0) {
    uVar1 = node->nodetype;
    pplVar2 = (lysp_node **)0x0;
    if (uVar1 < 0x4000) {
      if ((uVar1 == 1) || (uVar1 == 0x10)) {
        pplVar2 = (lysp_node **)&node[1].iffeatures;
      }
    }
    else if (uVar1 == 0x4000) {
      pplVar2 = (lysp_node **)&node[1].name;
    }
    else if (uVar1 == 0x8000) {
      pplVar2 = &node[1].next;
    }
    return (lysp_node_action **)pplVar2;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                ,0x595,"struct lysp_node_action **lysp_node_actions_p(struct lysp_node *)");
}

Assistant:

struct lysp_node_action **
lysp_node_actions_p(struct lysp_node *node)
{
    assert(node);

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysp_node_container *)node)->actions;
    case LYS_LIST:
        return &((struct lysp_node_list *)node)->actions;
    case LYS_GROUPING:
        return &((struct lysp_node_grp *)node)->actions;
    case LYS_AUGMENT:
        return &((struct lysp_node_augment *)node)->actions;
    default:
        return NULL;
    }
}